

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

bool __thiscall ritobin::io::impl_text_read::TextReader::read_bool(TextReader *this,bool *value)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_70;
  size_t local_60;
  char *local_58;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  size_t local_40;
  char *local_38;
  undefined1 local_30 [8];
  string_view word;
  bool *value_local;
  TextReader *this_local;
  
  word._M_str = value;
  _local_30 = read_word(this);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    local_40 = (size_t)local_30;
    local_38 = (char *)word._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"true");
    __x_00._M_str = local_38;
    __x_00._M_len = local_40;
    bVar1 = std::operator==(__x_00,local_50);
    if (bVar1) {
      *word._M_str = '\x01';
      this_local._7_1_ = true;
    }
    else {
      local_60 = (size_t)local_30;
      local_58 = (char *)word._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"false");
      __x._M_str = local_58;
      __x._M_len = local_60;
      bVar1 = std::operator==(__x,local_70);
      if (bVar1) {
        *word._M_str = '\0';
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool read_bool(bool& value) noexcept {
            auto const word = read_word();
            if (word.empty()) {
                return false;
            }
            if (word == "true") {
                value = true;
                return true;
            }
            else if (word == "false") {
                value = false;
                return true;
            }
            else {
                return false;
            }
        }